

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O3

void f_Ccall(lua_State *L,void *ud)

{
  StkId pTVar1;
  TValue *pTVar2;
  GCObject *pGVar3;
  
  if (L->ci == L->base_ci) {
    pTVar2 = &L->l_gt;
  }
  else {
    pTVar2 = (TValue *)&(((L->ci->func->value).gc)->h).array;
  }
  pGVar3 = (GCObject *)luaF_newCclosure(L,0,&((pTVar2->value).gc)->h);
  (pGVar3->h).node = *ud;
  pTVar1 = L->top;
  (pTVar1->value).gc = pGVar3;
  pTVar1->tt = 6;
  pTVar1 = L->top;
  L->top = pTVar1 + 1;
  pTVar1[1].value = *(Value *)((long)ud + 8);
  pTVar1[1].tt = 2;
  pTVar1 = L->top;
  L->top = pTVar1 + 1;
  luaD_call(L,pTVar1 + -1,0);
  return;
}

Assistant:

static void f_Ccall (lua_State *L, void *ud) {
  struct CCallS *c = cast(struct CCallS *, ud);
  Closure *cl;
  cl = luaF_newCclosure(L, 0, getcurrenv(L));
  cl->c.f = c->func;
  setclvalue(L, L->top, cl);  /* push function */
  api_incr_top(L);
  setpvalue(L->top, c->ud);  /* push only argument */
  api_incr_top(L);
  luaD_call(L, L->top - 2, 0);
}